

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

size_t Col_RopeFind(Col_Word rope,Col_Char c,size_t start,size_t max,int reverse)

{
  FindCharInfo info;
  Col_Char local_18;
  int local_14;
  size_t local_10;
  
  local_10 = 0xffffffffffffffff;
  local_18 = c;
  local_14 = reverse;
  Col_TraverseRopeChunks(rope,start,max,reverse,FindCharProc,&local_18,(size_t *)0x0);
  return local_10;
}

Assistant:

size_t
Col_RopeFind(
    Col_Word rope,      /*!< Rope to search character into. */
    Col_Char c,         /*!< Character to search for. */
    size_t start,       /*!< Starting index. */
    size_t max,         /*!< Maximum number of characters to search. */
    int reverse)        /*!< Whether to traverse in reverse order. */
{
    FindCharInfo info;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return SIZE_MAX;

    info.c = c;
    info.reverse = reverse;
    info.pos = SIZE_MAX;
    Col_TraverseRopeChunks(rope, start, max, reverse, FindCharProc, &info,
            NULL);

    return info.pos;
}